

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboDepthbufferTests.cpp
# Opt level: O0

int __thiscall deqp::gles3::Functional::FboDepthTests::init(FboDepthTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestNode *pTVar2;
  BasicFboDepthCase *this_00;
  char *pcVar3;
  DepthWriteClampCase *this_01;
  ulong extraout_RAX;
  DepthTestClampCase *this_02;
  ulong uVar4;
  uint local_44;
  int fmtNdx_2;
  TestCaseGroup *depthClampGroup_1;
  int fmtNdx_1;
  TestCaseGroup *depthClampGroup;
  int fmtNdx;
  TestCaseGroup *basicGroup;
  FboDepthTests *this_local;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic depth tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (depthClampGroup._0_4_ = 0; (int)depthClampGroup < 5;
      depthClampGroup._0_4_ = (int)depthClampGroup + 1) {
    this_00 = (BasicFboDepthCase *)operator_new(0x98);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar3 = FboTestUtil::getFormatName(init::depthFormats[(int)depthClampGroup]);
    BasicFboDepthCase::BasicFboDepthCase
              (this_00,pCVar1,pcVar3,"",init::depthFormats[(int)depthClampGroup],0x77,0x7f);
    tcu::TestNode::addChild(pTVar2,(TestNode *)this_00);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "depth_write_clamp","Depth write clamping tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (depthClampGroup_1._4_4_ = 0; depthClampGroup_1._4_4_ < 5;
      depthClampGroup_1._4_4_ = depthClampGroup_1._4_4_ + 1) {
    this_01 = (DepthWriteClampCase *)operator_new(0x98);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar3 = FboTestUtil::getFormatName(init::depthFormats[depthClampGroup_1._4_4_]);
    DepthWriteClampCase::DepthWriteClampCase
              (this_01,pCVar1,pcVar3,"",init::depthFormats[depthClampGroup_1._4_4_],0x77,0x7f);
    tcu::TestNode::addChild(pTVar2,(TestNode *)this_01);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "depth_test_clamp","Depth test value clamping tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  local_44 = 0;
  uVar4 = extraout_RAX;
  while ((int)local_44 < 5) {
    this_02 = (DepthTestClampCase *)operator_new(0x98);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar3 = FboTestUtil::getFormatName(init::depthFormats[(int)local_44]);
    DepthTestClampCase::DepthTestClampCase
              (this_02,pCVar1,pcVar3,"",init::depthFormats[(int)local_44],0x77,0x7f);
    tcu::TestNode::addChild(pTVar2,(TestNode *)this_02);
    local_44 = local_44 + 1;
    uVar4 = (ulong)local_44;
  }
  return (int)uVar4;
}

Assistant:

void FboDepthTests::init (void)
{
	static const deUint32 depthFormats[] =
	{
		GL_DEPTH_COMPONENT32F,
		GL_DEPTH_COMPONENT24,
		GL_DEPTH_COMPONENT16,
		GL_DEPTH32F_STENCIL8,
		GL_DEPTH24_STENCIL8
	};

	// .basic
	{
		tcu::TestCaseGroup* basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic", "Basic depth tests");
		addChild(basicGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthFormats); fmtNdx++)
			basicGroup->addChild(new BasicFboDepthCase(m_context, getFormatName(depthFormats[fmtNdx]), "", depthFormats[fmtNdx], 119, 127));
	}

	// .depth_write_clamp
	{
		tcu::TestCaseGroup* depthClampGroup = new tcu::TestCaseGroup(m_testCtx, "depth_write_clamp", "Depth write clamping tests");
		addChild(depthClampGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthFormats); fmtNdx++)
			depthClampGroup->addChild(new DepthWriteClampCase(m_context, getFormatName(depthFormats[fmtNdx]), "", depthFormats[fmtNdx], 119, 127));
	}

	// .depth_test_clamp
	{
		tcu::TestCaseGroup* depthClampGroup = new tcu::TestCaseGroup(m_testCtx, "depth_test_clamp", "Depth test value clamping tests");
		addChild(depthClampGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthFormats); fmtNdx++)
			depthClampGroup->addChild(new DepthTestClampCase(m_context, getFormatName(depthFormats[fmtNdx]), "", depthFormats[fmtNdx], 119, 127));
	}
}